

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O0

void xemmai::t_finalizes<xemmai::t_derives<xemmai::t_code,_xemmai::t_type_of<xemmai::t_object>_>_>::
     f_do_finalize(t_object *a_this,t_scan a_scan)

{
  t_code *this;
  t_scan a_scan_local;
  t_object *a_this_local;
  
  t_type_of<xemmai::t_code>::f_do_scan(a_this,a_scan);
  this = t_object::f_as<xemmai::t_code>(a_this);
  t_code::~t_code(this);
  return;
}

Assistant:

void t_finalizes<T_base>::f_do_finalize(t_object* a_this, t_scan a_scan)
{
	using t = typename T_base::t_what;
	t_type_of<t>::f_do_scan(a_this, a_scan);
	a_this->f_as<t>().~t();
}